

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_node_t * art_node4_erase(art_node4_t *node,art_key_chunk_t key_chunk)

{
  art_node_t aVar1;
  byte bVar2;
  _Bool _Var3;
  size_t __n;
  art_node_t in_SIL;
  art_node_t *in_RDI;
  size_t after_next;
  art_inner_node_t *inner_node;
  art_key_chunk_t remaining_child_key;
  art_node_t *remaining_child;
  uint8_t other_idx;
  size_t i;
  int idx;
  ulong local_20;
  int local_18;
  art_node_t *local_8;
  
  local_18 = -1;
  for (local_20 = 0; local_20 < (byte)in_RDI[7]; local_20 = local_20 + 1) {
    if (in_RDI[local_20 + 8] == in_SIL) {
      local_18 = (int)local_20;
    }
  }
  local_8 = in_RDI;
  if (local_18 != -1) {
    if (in_RDI[7] == (art_node_t)0x2) {
      bVar2 = (byte)local_18 ^ 1;
      local_8 = *(art_node_t **)(in_RDI + (ulong)bVar2 * 8 + 0x10);
      aVar1 = in_RDI[(ulong)bVar2 + 8];
      _Var3 = art_is_leaf(local_8);
      if (!_Var3) {
        memmove(local_8 + (long)(int)(uint)(byte)in_RDI[1] + 3,local_8 + 2,(ulong)(byte)local_8[1]);
        memcpy(local_8 + 2,in_RDI + 2,(ulong)(byte)in_RDI[1]);
        local_8[(ulong)(byte)in_RDI[1] + 2] = aVar1;
        local_8[1] = (art_node_t)((char)local_8[1] + (char)in_RDI[1] + '\x01');
      }
      roaring_free((void *)0x11b4ac);
    }
    else {
      __n = (size_t)(int)(((uint)(byte)in_RDI[7] - local_18) + -1);
      memmove(in_RDI + (long)local_18 + 8,in_RDI + (long)local_18 + 9,__n);
      memmove(in_RDI + (long)local_18 * 8 + 0x10,in_RDI + (long)local_18 * 8 + 0x18,__n << 3);
      in_RDI[7] = (art_node_t)((char)in_RDI[7] + -1);
    }
  }
  return local_8;
}

Assistant:

static inline art_node_t *art_node4_erase(art_node4_t *node,
                                          art_key_chunk_t key_chunk) {
    int idx = -1;
    for (size_t i = 0; i < node->count; ++i) {
        if (node->keys[i] == key_chunk) {
            idx = i;
        }
    }
    if (idx == -1) {
        return (art_node_t *)node;
    }
    if (node->count == 2) {
        // Only one child remains after erasing, so compress the path by
        // removing this node.
        uint8_t other_idx = idx ^ 1;
        art_node_t *remaining_child = node->children[other_idx];
        art_key_chunk_t remaining_child_key = node->keys[other_idx];
        if (!art_is_leaf(remaining_child)) {
            // Correct the prefix of the child node.
            art_inner_node_t *inner_node = (art_inner_node_t *)remaining_child;
            memmove(inner_node->prefix + node->base.prefix_size + 1,
                    inner_node->prefix, inner_node->prefix_size);
            memcpy(inner_node->prefix, node->base.prefix,
                   node->base.prefix_size);
            inner_node->prefix[node->base.prefix_size] = remaining_child_key;
            inner_node->prefix_size += node->base.prefix_size + 1;
        }
        roaring_free(node);
        return remaining_child;
    }
    // Shift other keys to maintain sorted order.
    size_t after_next = node->count - idx - 1;
    memmove(node->keys + idx, node->keys + idx + 1,
            after_next * sizeof(art_key_chunk_t));
    memmove(node->children + idx, node->children + idx + 1,
            after_next * sizeof(art_node_t *));
    node->count--;
    return (art_node_t *)node;
}